

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O0

int CfdGetPrivkeyFromWif(void *handle,char *wif,int network_type,char **privkey)

{
  bool bVar1;
  undefined8 uVar2;
  CfdException *this;
  char *pcVar3;
  undefined8 *in_RCX;
  char *in_RSI;
  CfdException *except;
  exception *std_except;
  Privkey key;
  NetType_conflict net_type;
  bool is_bitcoin;
  size_t wif_len;
  string *in_stack_fffffffffffffe30;
  undefined8 in_stack_fffffffffffffe38;
  CfdError error_code;
  allocator *paVar4;
  CfdException *in_stack_fffffffffffffe40;
  bool *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  string local_170;
  allocator local_149;
  string local_148;
  Privkey local_128;
  undefined1 local_102;
  allocator local_101;
  string local_100 [32];
  CfdSourceLocation local_e0;
  NetType local_c8;
  byte local_c1;
  size_t local_c0;
  undefined1 local_b2;
  allocator local_b1;
  string local_b0 [32];
  CfdSourceLocation local_90;
  undefined1 local_72;
  allocator local_71;
  string local_70 [32];
  CfdSourceLocation local_50;
  undefined8 *local_28;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  local_28 = in_RCX;
  local_18 = in_RSI;
  cfd::Initialize();
  if (local_28 == (undefined8 *)0x0) {
    local_50.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_50.filename = local_50.filename + 1;
    local_50.line = 0x420;
    local_50.funcname = "CfdGetPrivkeyFromWif";
    cfd::core::logger::warn<>(&local_50,"privkey is null.");
    local_72 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    paVar4 = &local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"Failed to parameter. privkey is null.",paVar4);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffe40,error_code,in_stack_fffffffffffffe30);
    local_72 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (!bVar1) {
    local_c0 = strnlen(local_18,0x34);
    local_c1 = 1;
    local_c8 = cfd::capi::ConvertNetType(in_stack_fffffffffffffe84,in_stack_fffffffffffffe78);
    if ((local_c1 & 1) == 0) {
      local_e0.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_key.cpp"
                   ,0x2f);
      local_e0.filename = local_e0.filename + 1;
      local_e0.line = 0x430;
      local_e0.funcname = "CfdGetPrivkeyFromWif";
      cfd::core::logger::warn<>(&local_e0,"privkey\'s network_type is invalid.");
      local_102 = 1;
      this = (CfdException *)__cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_100,"Failed to parameter. privkey\'s network_type is invalid.",&local_101);
      cfd::core::CfdException::CfdException(this,error_code,in_stack_fffffffffffffe30);
      local_102 = 0;
      __cxa_throw(this,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    paVar4 = &local_149;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_148,local_18,paVar4);
    cfd::core::Privkey::FromWif(&local_128,&local_148,local_c8,local_c0 != 0x33);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    cfd::core::Privkey::GetHex_abi_cxx11_(&local_170,&local_128);
    pcVar3 = cfd::capi::CreateString
                       ((string *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    *local_28 = pcVar3;
    std::__cxx11::string::~string((string *)&local_170);
    local_4 = 0;
    cfd::core::Privkey::~Privkey((Privkey *)0x60664a);
    return local_4;
  }
  local_90.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/src/capi/cfdcapi_key.cpp"
               ,0x2f);
  local_90.filename = local_90.filename + 1;
  local_90.line = 0x426;
  local_90.funcname = "CfdGetPrivkeyFromWif";
  cfd::core::logger::warn<>(&local_90,"wif is null or empty.");
  local_b2 = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"Failed to parameter. wif is null or empty.",&local_b1);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffe40,error_code,in_stack_fffffffffffffe30);
  local_b2 = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetPrivkeyFromWif(
    void* handle, const char* wif, int network_type, char** privkey) {
  try {
    cfd::Initialize();
    if (privkey == nullptr) {
      warn(CFD_LOG_SOURCE, "privkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey is null.");
    }
    if (IsEmptyString(wif)) {
      warn(CFD_LOG_SOURCE, "wif is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. wif is null or empty.");
    }

    size_t wif_len = strnlen(wif, kPrivkeyWifUncompressSize + 1);
    bool is_bitcoin = true;
    cfd::core::NetType net_type = ConvertNetType(network_type, &is_bitcoin);
    if (!is_bitcoin) {
      warn(CFD_LOG_SOURCE, "privkey's network_type is invalid.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey's network_type is invalid.");
    }
    Privkey key = Privkey::FromWif(
        wif, net_type, (wif_len != kPrivkeyWifUncompressSize));
    *privkey = CreateString(key.GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}